

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.h
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::IsTopologySplit
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder> *this,
          int encoder_symbol_id,EdgeFaceName *out_face_edge,int *out_encoder_split_symbol_id)

{
  size_type sVar1;
  reference pvVar2;
  uint32_t *in_RCX;
  byte *in_RDX;
  uint in_ESI;
  vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_> *in_RDI;
  bool local_1;
  
  sVar1 = std::vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
          ::size(in_RDI + 3);
  if (sVar1 == 0) {
    local_1 = false;
  }
  else {
    pvVar2 = std::
             vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>::
             back(in_RDI);
    if (in_ESI < pvVar2->source_symbol_id) {
      *in_RCX = 0xffffffff;
      local_1 = true;
    }
    else {
      pvVar2 = std::
               vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
               ::back(in_RDI);
      if (pvVar2->source_symbol_id == in_ESI) {
        pvVar2 = std::
                 vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                 ::back(in_RDI);
        *in_RDX = pvVar2->field_0x8 & 1;
        pvVar2 = std::
                 vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                 ::back(in_RDI);
        *in_RCX = pvVar2->split_symbol_id;
        std::vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>::
        pop_back((vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                  *)0x177e45);
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool IsTopologySplit(int encoder_symbol_id, EdgeFaceName *out_face_edge,
                       int *out_encoder_split_symbol_id) {
    if (topology_split_data_.size() == 0) {
      return false;
    }
    if (topology_split_data_.back().source_symbol_id >
        static_cast<uint32_t>(encoder_symbol_id)) {
      // Something is wrong; if the desired source symbol is greater than the
      // current encoder_symbol_id, we missed it, or the input was tampered
      // (|encoder_symbol_id| keeps decreasing).
      // Return invalid symbol id to notify the decoder that there was an
      // error.
      *out_encoder_split_symbol_id = -1;
      return true;
    }
    if (topology_split_data_.back().source_symbol_id != encoder_symbol_id) {
      return false;
    }
    *out_face_edge =
        static_cast<EdgeFaceName>(topology_split_data_.back().source_edge);
    *out_encoder_split_symbol_id = topology_split_data_.back().split_symbol_id;
    // Remove the latest split event.
    topology_split_data_.pop_back();
    return true;
  }